

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void shuffle(vector<int,_std::allocator<int>_> *v)

{
  uint uVar1;
  size_type sVar2;
  reference __a;
  reference __b;
  vector<int,_std::allocator<int>_> *in_RDI;
  int n;
  undefined4 local_c;
  
  srand(9);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
  for (local_c = (uint)sVar2; 1 < (int)local_c; local_c = local_c - 1) {
    __a = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)(int)(local_c - 1));
    uVar1 = rand();
    __b = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(ulong)uVar1 % (ulong)local_c);
    std::swap<int>(__a,__b);
  }
  return;
}

Assistant:

static void shuffle(vector<int>* v) {
  srand(9);
  for (int n = v->size(); n >= 2; n--) {
    swap((*v)[n - 1], (*v)[static_cast<unsigned>(rand()) % n]);
  }
}